

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

__pid_t __thiscall kj::EventLoop::wait(EventLoop *this,void *__stat_loc)

{
  EventPort *pEVar1;
  int iVar2;
  __pid_t _Var3;
  int in_ECX;
  nfds_t in_RDX;
  nfds_t __nfds;
  Fault f;
  Fault local_10;
  
  if (this->wouldSleepHead != (Event *)0x0) {
    iVar2 = poll(this,(pollfd *)__stat_loc,in_RDX,in_ECX);
    return iVar2;
  }
  pEVar1 = (this->port).ptr;
  if (pEVar1 != (EventPort *)0x0) {
    iVar2 = (**pEVar1->_vptr_EventPort)();
    if (((char)iVar2 != '\0') && ((this->executor).ptr.ptr != (Executor *)0x0)) {
      iVar2 = Executor::poll((this->executor).ptr.ptr,(pollfd *)__stat_loc,__nfds,in_ECX);
      return iVar2;
    }
    return iVar2;
  }
  if ((this->executor).ptr.ptr != (Executor *)0x0) {
    _Var3 = Executor::wait((this->executor).ptr.ptr,__stat_loc);
    return _Var3;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x769,FAILED,(char *)0x0,"\"Nothing to wait for; this thread would hang forever.\"",
             (char (*) [53])"Nothing to wait for; this thread would hang forever.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void EventLoop::wait() {
  if (wouldSleepHead != nullptr) {
    // Oh, someone wants to know when we are going to sleep. Use poll() instead so that we don't
    // actually sleep. poll() will queue the would-sleep waiter if needed.
    poll();
    return;
  }

  KJ_IF_SOME(p, port) {
    if (p.wait()) {
      // Another thread called wake(). Check for cross-thread events.
      KJ_IF_SOME(e, executor) {
        e->poll();
      }
    }
  } else KJ_IF_SOME(e, executor) {
    e->wait();
  } else {
    KJ_FAIL_REQUIRE("Nothing to wait for; this thread would hang forever.");
  }
}